

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zip_source_pkware_decode.c
# Opt level: O2

zip_source_t *
zip_source_pkware_decode(zip_t *za,zip_source_t *src,zip_uint16_t em,int flags,char *password)

{
  trad_pkware *ctx;
  char *pcVar1;
  zip_source_t *pzVar2;
  undefined6 in_register_00000012;
  int ze;
  
  if ((((int)CONCAT62(in_register_00000012,em) == 1) && (src != (zip_source_t *)0x0)) &&
     (password != (char *)0x0)) {
    if ((flags & 1U) == 0) {
      ctx = (trad_pkware *)malloc(0x28);
      if (ctx != (trad_pkware *)0x0) {
        pcVar1 = strdup(password);
        ctx->password = pcVar1;
        if (pcVar1 == (char *)0x0) {
          zip_error_set(&za->error,0xe,0);
          free(ctx);
          return (zip_source_t *)0x0;
        }
        zip_error_init(&ctx->error);
        pzVar2 = zip_source_layered(za,src,pkware_decrypt,ctx);
        if (pzVar2 != (zip_source_t *)0x0) {
          return pzVar2;
        }
        trad_pkware_free(ctx);
        return (zip_source_t *)0x0;
      }
      ze = 0xe;
    }
    else {
      ze = 0x18;
    }
  }
  else {
    ze = 0x12;
  }
  zip_error_set(&za->error,ze,0);
  return (zip_source_t *)0x0;
}

Assistant:

zip_source_t *
zip_source_pkware_decode(zip_t *za, zip_source_t *src, zip_uint16_t em, int flags, const char *password) {
    struct trad_pkware *ctx;
    zip_source_t *s2;

    if (password == NULL || src == NULL || em != ZIP_EM_TRAD_PKWARE) {
        zip_error_set(&za->error, ZIP_ER_INVAL, 0);
        return NULL;
    }
    if (flags & ZIP_CODEC_ENCODE) {
        zip_error_set(&za->error, ZIP_ER_ENCRNOTSUPP, 0);
        return NULL;
    }

    if ((ctx = trad_pkware_new(password, &za->error)) == NULL) {
        return NULL;
    }

    if ((s2 = zip_source_layered(za, src, pkware_decrypt, ctx)) == NULL) {
        trad_pkware_free(ctx);
        return NULL;
    }

    return s2;
}